

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void mg_hexdump_connection(mg_connection *nc,char *path,void *buf,int num_bytes,int ev)

{
  int iVar1;
  FILE *__stream;
  undefined8 *puVar2;
  time_t tVar3;
  uint dst_len;
  char *pcVar4;
  socket_address sa_1;
  char dst [60];
  char src [60];
  
  iVar1 = strcmp(path,"-");
  if (iVar1 == 0) {
    puVar2 = (undefined8 *)&stdout;
  }
  else {
    iVar1 = strcmp(path,"--");
    if (iVar1 != 0) {
      __stream = fopen64(path,"a");
      goto LAB_0010a523;
    }
    puVar2 = (undefined8 *)&stderr;
  }
  __stream = (FILE *)*puVar2;
LAB_0010a523:
  if (__stream != (FILE *)0x0) {
    src[0] = '\b';
    src[1] = '\0';
    src[2] = '\0';
    src[3] = '\0';
    dst[0] = '\0';
    dst[1] = '\0';
    dst[2] = '\0';
    dst[3] = '\0';
    dst[4] = '\0';
    dst[5] = '\0';
    dst[6] = '\0';
    dst[7] = '\0';
    dst[8] = '\0';
    dst[9] = '\0';
    dst[10] = '\0';
    dst[0xb] = '\0';
    dst[0xc] = '\0';
    dst[0xd] = '\0';
    dst[0xe] = '\0';
    dst[0xf] = '\0';
    getsockname(nc->sock,(sockaddr *)&((socket_address *)dst)->sa,(socklen_t *)src);
    mg_sock_addr_to_str((socket_address *)dst,src,0x3c,3);
    dst[0] = '\b';
    dst[1] = '\0';
    dst[2] = '\0';
    dst[3] = '\0';
    sa_1._0_8_ = 0;
    sa_1._8_1_ = '\0';
    sa_1._9_1_ = '\0';
    sa_1._10_1_ = '\0';
    sa_1._11_1_ = '\0';
    sa_1._12_1_ = '\0';
    sa_1._13_1_ = '\0';
    sa_1._14_1_ = '\0';
    sa_1._15_1_ = '\0';
    getpeername(nc->sock,(sockaddr *)&sa_1.sa,(socklen_t *)dst);
    mg_sock_addr_to_str(&sa_1,dst,0x3c,7);
    tVar3 = time((time_t *)0x0);
    if (ev == 1) {
      pcVar4 = "<A";
    }
    else if (ev == 3) {
      pcVar4 = "<-";
    }
    else if (ev == 4) {
      pcVar4 = "->";
    }
    else {
      pcVar4 = "XX";
      if (ev == 2) {
        pcVar4 = "C>";
      }
    }
    fprintf(__stream,"%lu %p %s %s %s %d\n",tVar3,nc,src,pcVar4,dst,(ulong)(uint)num_bytes);
    if (0 < num_bytes) {
      dst_len = num_bytes * 5 + 100;
      pcVar4 = (char *)malloc((ulong)dst_len);
      if (pcVar4 != (char *)0x0) {
        mg_hexdump(buf,num_bytes,pcVar4,dst_len);
        fputs(pcVar4,__stream);
        free(pcVar4);
      }
    }
    if ((__stream != _stdin) && (__stream != _stdout)) {
      fclose(__stream);
    }
  }
  return;
}

Assistant:

void mg_hexdump_connection(struct mg_connection *nc, const char *path,
                           const void *buf, int num_bytes, int ev) {
    FILE *fp = NULL;
    char *hexbuf, src[60], dst[60];
    int buf_size = num_bytes * 5 + 100;

    if (strcmp(path, "-") == 0) {
        fp = stdout;
    } else if (strcmp(path, "--") == 0) {
        fp = stderr;
#ifndef MG_DISABLE_FILESYSTEM
    } else {
        fp = fopen(path, "a");
#endif
    }
    if (fp == NULL) return;

    mg_conn_addr_to_str(nc, src, sizeof(src),
                        MG_SOCK_STRINGIFY_IP | MG_SOCK_STRINGIFY_PORT);
    mg_conn_addr_to_str(nc, dst, sizeof(dst), MG_SOCK_STRINGIFY_IP |
                                              MG_SOCK_STRINGIFY_PORT |
                                              MG_SOCK_STRINGIFY_REMOTE);
    fprintf(
            fp, "%lu %p %s %s %s %d\n", (unsigned long) time(NULL), nc, src,
            ev == MG_EV_RECV ? "<-" : ev == MG_EV_SEND
                                      ? "->"
                                      : ev == MG_EV_ACCEPT
                                        ? "<A"
                                        : ev == MG_EV_CONNECT ? "C>" : "XX",
            dst, num_bytes);
    if (num_bytes > 0 && (hexbuf = (char *) MG_MALLOC(buf_size)) != NULL) {
        mg_hexdump(buf, num_bytes, hexbuf, buf_size);
        fprintf(fp, "%s", hexbuf);
        MG_FREE(hexbuf);
    }
    if (fp != stdin && fp != stdout) fclose(fp);
}